

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_InvMap(Vec_Int_t *vCounts)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = vCounts->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  iVar4 = vCounts->nSize;
  if (0 < (long)iVar4) {
    piVar2 = vCounts->pArray;
    lVar5 = 0;
    iVar6 = 0;
    do {
      if (piVar2[lVar5] != 0) {
        if (iVar1 <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar5] = iVar6;
        iVar6 = iVar6 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar4 != lVar5);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Pdr_InvMap( Vec_Int_t * vCounts )
{
    int i, k = 0, Count;
    Vec_Int_t * vMap = Vec_IntStart( Vec_IntSize(vCounts) );
    Vec_IntForEachEntry( vCounts, Count, i )
        if ( Count )
            Vec_IntWriteEntry( vMap, i, k++ );
    return vMap;
}